

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,CordBuffer *buffer,size_t size_hint)

{
  size_t sVar1;
  size_t sVar2;
  State SVar3;
  size_t size_hint_local;
  CordBuffer *buffer_local;
  CordOutputStream *this_local;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_008a99f8;
  absl::lts_20240722::Cord::Cord(&this->cord_);
  this->size_hint_ = size_hint;
  sVar1 = absl::lts_20240722::CordBuffer::length(buffer);
  sVar2 = absl::lts_20240722::CordBuffer::capacity(buffer);
  SVar3 = kFull;
  if (sVar1 < sVar2) {
    SVar3 = kPartial;
  }
  this->state_ = SVar3;
  absl::lts_20240722::CordBuffer::CordBuffer(&this->buffer_,buffer);
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::CordBuffer buffer, size_t size_hint)
    : size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}